

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

int AF_AActor_A_FreezeDeathChunks
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  player_t *ppVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  APlayerPawn *this;
  AActor *pAVar13;
  FState *pFVar14;
  int iVar15;
  AActor *ent;
  char *__assertion;
  AActor *unaff_R15;
  FName local_58;
  FName local_54;
  FName local_50;
  FSoundID local_4c;
  DVector3 local_48;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004a70ef;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (ent != (AActor *)0x0) {
        bVar9 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar9) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004a70ef;
        }
        goto LAB_004a6d2b;
      }
    }
    else if (ent != (AActor *)0x0) goto LAB_004a70df;
    ent = (AActor *)0x0;
LAB_004a6d2b:
    bVar9 = TVector3<double>::isZero(&ent->Vel);
    if ((bVar9) || (((ent->flags6).Value & 0x20000) != 0)) {
      (ent->Vel).X = 0.0;
      (ent->Vel).Y = 0.0;
      (ent->Vel).Z = 0.0;
      local_4c.ID = S_FindSound("misc/icebreak");
      S_Sound(ent,4,&local_4c,1.0,1.0);
      uVar5 = (long)(int)(ent->radius * ent->Height) / 0x20;
      uVar8 = 4;
      if (4 < (int)uVar5) {
        uVar8 = uVar5;
      }
      iVar10 = FRandom::Random2(&pr_freeze);
      iVar15 = iVar10 % (int)((uVar8 & 0xffffffff) >> 2) + (int)uVar8;
      iVar10 = 0x18;
      if (0x18 < iVar15) {
        iVar10 = iVar15;
      }
      for (; -1 < iVar10; iVar10 = iVar10 + -1) {
        iVar15 = FRandom::operator()(&pr_freeze);
        dVar1 = ent->radius;
        iVar11 = FRandom::operator()(&pr_freeze);
        dVar2 = ent->radius;
        iVar12 = FRandom::operator()(&pr_freeze);
        dVar3 = ent->Height;
        FName::FName(&local_50,"IceChunk");
        AActor::Vec3Offset(&local_48,ent,(double)(iVar15 + -0x80) * dVar1 * 0.0078125,
                           (double)(iVar11 + -0x80) * dVar2 * 0.0078125,
                           ((double)iVar12 * dVar3) / 255.0,false);
        unaff_R15 = Spawn(&local_50,&local_48,ALLOW_REPLACE);
        if (unaff_R15 != (AActor *)0x0) {
          pFVar14 = unaff_R15->SpawnState;
          iVar15 = FRandom::operator()(&pr_freeze);
          AActor::SetState(unaff_R15,pFVar14 + iVar15 % 3,false);
          iVar15 = FRandom::Random2(&pr_freeze);
          (unaff_R15->Vel).X = (double)iVar15 * 0.0078125;
          iVar15 = FRandom::Random2(&pr_freeze);
          dVar1 = (((unaff_R15->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
          auVar6._8_4_ = SUB84(dVar1,0);
          auVar6._0_8_ = (double)iVar15 * 0.0078125;
          auVar6._12_4_ = (int)((ulong)dVar1 >> 0x20);
          (unaff_R15->Vel).Y = (double)iVar15 * 0.0078125;
          (unaff_R15->Vel).Z = (double)auVar6._8_8_;
          unaff_R15->RenderStyle = ent->RenderStyle;
          unaff_R15->Alpha = ent->Alpha;
        }
      }
      if (ent->player != (player_t *)0x0) {
        FName::FName(&local_54,"IceChunkHead");
        local_48.Z = ent->player->mo->ViewHeight + (ent->__Pos).Z;
        local_48.X = (ent->__Pos).X;
        local_48.Y = (ent->__Pos).Y;
        this = (APlayerPawn *)Spawn(&local_54,&local_48,ALLOW_REPLACE);
        if (this != (APlayerPawn *)0x0) {
          iVar10 = FRandom::Random2(&pr_freeze);
          ((DVector3 *)((DRotator *)(&(this->super_AActor).super_DThinker + 3) + 1))->X =
               (double)iVar10 * 0.0078125;
          iVar10 = FRandom::Random2(&pr_freeze);
          dVar1 = (((unaff_R15->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
          auVar7._8_4_ = SUB84(dVar1,0);
          auVar7._0_8_ = (double)iVar10 * 0.0078125;
          auVar7._12_4_ = (int)((ulong)dVar1 >> 0x20);
          (this->super_AActor).Vel.Y = (double)iVar10 * 0.0078125;
          (this->super_AActor).Vel.Z = (double)auVar7._8_8_;
          *(int *)((long)(&(this->super_AActor).super_DThinker + 9) + 4) = ent->health;
          (((DRotator *)(&(this->super_AActor).super_DThinker + 3))->Yaw).Degrees =
               (ent->Angles).Yaw.Degrees;
          bVar9 = DObject::IsKindOf((DObject *)this,APlayerPawn::RegistrationInfo.MyClass);
          if (bVar9) {
            ppVar4 = ent->player;
            *(player_t **)(&(this->super_AActor).super_DThinker + 10) = ppVar4;
            ppVar4->mo = this;
            ent->player = (player_t *)0x0;
            AActor::ObtainInventory((AActor *)this,ent);
          }
          (this->super_AActor).Angles.Pitch.Degrees = 0.0;
          (this->super_AActor).RenderStyle = ent->RenderStyle;
          (this->super_AActor).Alpha = ent->Alpha;
          pAVar13 = GC::ReadBarrier<AActor>((AActor **)&((this->super_AActor).player)->camera);
          if (pAVar13 == ent) {
            (((this->super_AActor).player)->camera).field_0.p = (AActor *)this;
          }
        }
      }
      if (((ent->flags4).Value & 8) != 0) {
        A_BossDeath(ent);
      }
      A_Unblock(ent,true);
      local_58.Index = 1;
      pFVar14 = AActor::FindState(ent,&local_58);
      AActor::SetState(ent,pFVar14,false);
    }
    else {
      ent->tics = 0x69;
    }
    return 0;
  }
LAB_004a70df:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004a70ef:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x83,
                "int AF_AActor_A_FreezeDeathChunks(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeathChunks)
{
	PARAM_SELF_PROLOGUE(AActor);

	int i;
	int numChunks;
	AActor *mo;
	
	if (!self->Vel.isZero() && !(self->flags6 & MF6_SHATTERING))
	{
		self->tics = 3*TICRATE;
		return 0;
	}
	self->Vel.Zero();
	S_Sound (self, CHAN_BODY, "misc/icebreak", 1, ATTN_NORM);

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An actor with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int>(4, int(self->radius * self->Height)/32);
	i = (pr_freeze.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_freeze() - 128)*self->radius / 128;
		double yo = (pr_freeze() - 128)*self->radius / 128;
		double zo = (pr_freeze()*self->Height / 255);

		mo = Spawn("IceChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + (pr_freeze()%3));
			mo->Vel.X = pr_freeze.Random2() / 128.;
			mo->Vel.Y = pr_freeze.Random2() / 128.;
			mo->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
		}
	}
	if (self->player)
	{ // attach the player's view to a chunk of ice
		AActor *head = Spawn("IceChunkHead", self->PosPlusZ(self->player->mo->ViewHeight), ALLOW_REPLACE);
		if (head != NULL)
		{
			head->Vel.X = pr_freeze.Random2() / 128.;
			head->Vel.Y = pr_freeze.Random2() / 128.;
			head->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;

			head->health = self->health;
			head->Angles.Yaw = self->Angles.Yaw;
			if (head->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				head->player = self->player;
				head->player->mo = static_cast<APlayerPawn*>(head);
				self->player = NULL;
				head->ObtainInventory (self);
			}
			head->Angles.Pitch = 0.;
			head->RenderStyle = self->RenderStyle;
			head->Alpha = self->Alpha;
			if (head->player->camera == self)
			{
				head->player->camera = head;
			}
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->SetState(self->FindState(NAME_Null));
	return 0;
}